

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

void __thiscall mp::pre::ValuePresolverImpl::Add(ValuePresolverImpl *this,LinkRange br)

{
  _Elt_pointer pLVar1;
  
  pLVar1 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
           super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar1 != (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
                super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pLVar1 == (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
                  super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_first) {
      pLVar1 = (this->brl_).super_deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>.
               super__Deque_base<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if ((pLVar1[-1].b_ == br.b_) && (pLVar1[-1].ir_.end_ == br.ir_.beg_)) {
      pLVar1[-1].ir_.end_ = br.ir_.end_;
      return;
    }
  }
  ExportRemainingEntries(this);
  LinkRangeList::Add(&this->brl_,br);
  return;
}

Assistant:

void Add(LinkRange br) {
    if (brl_.empty() || !brl_.back().TryExtendBy(br)) {
      ExportRemainingEntries();       // new entry, export existing
      brl_.Add(br);
    }
  }